

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

bool __thiscall
QWidgetPrivate::removeFromFocusChain
          (QWidgetPrivate *this,FocusChainRemovalRules rules,FocusDirection direction)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  char *t;
  QWidget *widget;
  long in_FS_OFFSET;
  undefined1 auStack_68 [16];
  undefined4 local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  QDebug local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&this->field_0x8;
  bVar4 = isFocusChainConsistent(this);
  if (bVar4) {
    lVar2 = *(long *)&this->field_0x8;
    if ((*(long *)(*(long *)(lVar2 + 8) + 0x80) != lVar2) ||
       (*(long *)(*(long *)(lVar2 + 8) + 0x88) != lVar2)) {
      if (((uint)rules.super_QFlagsStorageHelper<QWidgetPrivate::FocusChainRemovalRule,_4>.
                 super_QFlagsStorage<QWidgetPrivate::FocusChainRemovalRule>.i & 1) != 0) {
        (**(code **)(*plVar1 + 0x198))(plVar1,direction == Next);
      }
      lVar2 = *(long *)(plVar1[1] + 0x80);
      lVar3 = *(long *)(plVar1[1] + 0x88);
      *(long *)(*(long *)(lVar3 + 8) + 0x80) = lVar2;
      *(long *)(*(long *)(lVar2 + 8) + 0x88) = lVar3;
      initFocusChain(this);
      lcWidgetFocus();
      bVar4 = true;
      if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
      {
        local_58._0_1_ = (QPaintDevice)0x2;
        local_58._1_3_ = 0;
        local_54 = 0;
        uStack_4c = 0;
        local_44 = 0;
        local_40 = lcWidgetFocus::category.name;
        QMessageLogger::debug();
        ::operator<<((Stream *)&local_30,(QWidget *)auStack_68);
        QDebug::operator<<(&local_30,"removed from focus chain.");
        QDebug::~QDebug(&local_30);
        QDebug::~QDebug((QDebug *)auStack_68);
      }
      goto LAB_002f1863;
    }
    lcWidgetFocus();
    if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_58._0_1_ = (QPaintDevice)0x2;
      local_58._1_3_ = 0;
      local_54 = 0;
      uStack_4c = 0;
      local_44 = 0;
      local_40 = lcWidgetFocus::category.name;
      widget = (QWidget *)(auStack_68 + 8);
      QMessageLogger::debug();
      ::operator<<((Stream *)&local_30,widget);
      t = "wasn\'t removed, because it is not part of a focus chain.";
      goto LAB_002f1849;
    }
  }
  else {
    lcWidgetFocus();
    if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_58._0_1_ = (QPaintDevice)0x2;
      local_58._1_3_ = 0;
      local_54 = 0;
      uStack_4c = 0;
      local_44 = 0;
      local_40 = lcWidgetFocus::category.name;
      widget = (QWidget *)&stack0xffffffffffffffc8;
      QMessageLogger::debug();
      ::operator<<((Stream *)&local_30,widget);
      t = "wasn\'t removed, because of inconsistent focus chain.";
LAB_002f1849:
      QDebug::operator<<(&local_30,t);
      QDebug::~QDebug(&local_30);
      QDebug::~QDebug((QDebug *)widget);
    }
  }
  bVar4 = false;
LAB_002f1863:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetPrivate::removeFromFocusChain(FocusChainRemovalRules rules, FocusDirection direction)
{
    Q_Q(QWidget);
    if (!isFocusChainConsistent()) {
#ifdef QT_DEBUG
        if (rules.testFlag(FocusChainRemovalRule::AssertConsistency))
            qFatal() << q << "has inconsistent focus chain.";
#endif
        qCDebug(lcWidgetFocus) << q << "wasn't removed, because of inconsistent focus chain.";
        return false;
    }

    if (!isInFocusChain()) {
        qCDebug(lcWidgetFocus) << q << "wasn't removed, because it is not part of a focus chain.";
        return false;
    }

    if (rules.testFlag(FocusChainRemovalRule::EnsureFocusOut))
        q->focusNextPrevChild(direction == FocusDirection::Next);

    FOCUS_NEXT(FOCUS_PREV(q)) = FOCUS_NEXT(q);
    FOCUS_PREV(FOCUS_NEXT(q)) = FOCUS_PREV(q);
    initFocusChain();
    qCDebug(lcWidgetFocus) << q << "removed from focus chain.";
    return true;
}